

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O0

void key_press_proc(Am_Object *command)

{
  bool bVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  Am_Object local_48 [7];
  bool active;
  Am_Object local_40 [8];
  Am_Object animator;
  Am_Input_Char local_34;
  Am_Input_Char local_30 [5];
  Am_Input_Char local_1c;
  Am_Object local_18 [4];
  Am_Input_Char c;
  Am_Object inter;
  Am_Object *command_local;
  
  Am_Object::Get_Owner(local_18,(Am_Slot_Flags)command);
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)local_18,0x11b);
  Am_Input_Char::Am_Input_Char(&local_1c,pAVar2);
  Am_Input_Char::Am_Input_Char(local_30,"q",true);
  bVar1 = Am_Input_Char::operator==(&local_1c,local_30[0]);
  if (bVar1) {
    Am_Exit_Main_Event_Loop();
  }
  else {
    Am_Input_Char::Am_Input_Char(&local_34,"a",true);
    bVar1 = Am_Input_Char::operator==(&local_1c,local_34);
    if (bVar1) {
      Am_Object::Get_Owner(local_48,(Am_Slot_Flags)local_18);
      pAVar2 = (Am_Value *)Am_Object::Get((ushort)local_48,(ulong)ANIMATOR);
      Am_Object::Am_Object(local_40,pAVar2);
      Am_Object::~Am_Object(local_48);
      pAVar2 = (Am_Value *)Am_Object::Get((ushort)local_40,0xcc);
      bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
      Am_Object::Set((ushort)local_40,true,(ulong)((byte)~bVar1 & 1));
      Am_Object::~Am_Object(local_40);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"Keyboard Commands:");
      poVar3 = (ostream *)
               std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"  a - toggle animation");
      poVar3 = (ostream *)
               std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"  q - quit");
      std::ostream::operator<<((ostream *)poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  Am_Object::~Am_Object(local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, key_press, (Am_Object command))
{
  Am_Object inter = command.Get_Owner();
  Am_Input_Char c = inter.Get(Am_START_CHAR);
  if (c == "q")
    Am_Exit_Main_Event_Loop();
  else if (c == "a") {
    Am_Object animator = inter.Get_Owner().Get(ANIMATOR);
    bool active = animator.Get(Am_ACTIVE);
    animator.Set(Am_ACTIVE, !active);
  } else
    cout << "Keyboard Commands:" << endl
         << "  a - toggle animation" << endl
         << "  q - quit" << endl;
}